

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeInitPage(MemPage *pPage)

{
  byte bVar1;
  u8 uVar2;
  u8 uVar3;
  uint uVar4;
  BtShared *pBVar5;
  u8 *puVar6;
  ushort uVar7;
  u16 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  u32 size;
  u32 next;
  int sz;
  int i;
  int iCellLast;
  int iCellFirst;
  int top;
  int nFree;
  u16 cellOffset;
  int usableSize;
  BtShared *pBt;
  u8 *data;
  u8 hdr;
  int pc;
  MemPage *pPage_local;
  
  if (pPage->isInit == '\0') {
    pBVar5 = pPage->pBt;
    bVar1 = pPage->hdrOffset;
    puVar6 = pPage->aData;
    iVar9 = decodeFlags(pPage,(uint)puVar6[bVar1]);
    if (iVar9 != 0) {
      iVar9 = sqlite3CorruptError(0xeccd);
      return iVar9;
    }
    pPage->maskPage = (short)pBVar5->pageSize - 1;
    pPage->nOverflow = '\0';
    uVar4 = pBVar5->usableSize;
    uVar7 = bVar1 + 8 + (ushort)pPage->childPtrSize;
    pPage->cellOffset = uVar7;
    pPage->aDataEnd = puVar6 + (int)uVar4;
    pPage->aCellIdx = puVar6 + uVar7;
    pPage->aDataOfst = puVar6 + pPage->childPtrSize;
    uVar2 = puVar6[(int)(bVar1 + 5)];
    uVar3 = puVar6[(long)(int)(bVar1 + 5) + 1];
    pPage->nCell = CONCAT11(puVar6[(int)(bVar1 + 3)],puVar6[(long)(int)(bVar1 + 3) + 1]);
    if ((pBVar5->pageSize - 8) / 6 < (uint)pPage->nCell) {
      iVar9 = sqlite3CorruptError(0xecdf);
      return iVar9;
    }
    uVar10 = (uint)uVar7 + (uint)pPage->nCell * 2;
    sz = uVar4 - 4;
    if ((pBVar5->db->flags & 0x20000000U) != 0) {
      if (pPage->leaf == '\0') {
        sz = uVar4 - 5;
      }
      for (next = 0; (int)next < (int)(uint)pPage->nCell; next = next + 1) {
        uVar11 = (uint)CONCAT11(puVar6[(int)((uint)uVar7 + next * 2)],
                                puVar6[(long)(int)((uint)uVar7 + next * 2) + 1]);
        if ((uVar11 < uVar10) || (sz < (int)uVar11)) {
          iVar9 = sqlite3CorruptError(0xecfb);
          return iVar9;
        }
        uVar8 = (*pPage->xCellSize)(pPage,puVar6 + (int)uVar11);
        if ((int)uVar4 < (int)(uVar11 + uVar8)) {
          iVar9 = sqlite3CorruptError(0xed00);
          return iVar9;
        }
      }
      if (pPage->leaf == '\0') {
        sz = sz + 1;
      }
    }
    uVar11 = (uint)CONCAT11(puVar6[(int)(bVar1 + 1)],puVar6[(long)(int)(bVar1 + 1) + 1]);
    iCellFirst = (uint)puVar6[(int)(bVar1 + 7)] + (CONCAT11(uVar2,uVar3) - 1 & 0xffff) + 1;
    if (uVar11 != 0) {
      if (uVar11 < uVar10) {
        iVar9 = sqlite3CorruptError(0xed12);
        return iVar9;
      }
      do {
        data._4_4_ = uVar11;
        if (sz < (int)data._4_4_) {
          iVar9 = sqlite3CorruptError(0xed16);
          return iVar9;
        }
        uVar11 = (uint)CONCAT11(puVar6[(int)data._4_4_],puVar6[(long)(int)data._4_4_ + 1]);
        uVar12 = (uint)CONCAT11(puVar6[(int)(data._4_4_ + 2)],
                                puVar6[(long)(int)(data._4_4_ + 2) + 1]);
        iCellFirst = iCellFirst + uVar12;
      } while (data._4_4_ + uVar12 + 3 < uVar11);
      if (uVar11 != 0) {
        iVar9 = sqlite3CorruptError(0xed1f);
        return iVar9;
      }
      if (uVar4 < data._4_4_ + uVar12) {
        iVar9 = sqlite3CorruptError(0xed22);
        return iVar9;
      }
    }
    if ((int)uVar4 < iCellFirst) {
      iVar9 = sqlite3CorruptError(0xed2e);
      return iVar9;
    }
    pPage->nFree = (short)iCellFirst - (short)uVar10;
    pPage->isInit = '\x01';
  }
  return 0;
}

Assistant:

static int btreeInitPage(MemPage *pPage){

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );

  if( !pPage->isInit ){
    int pc;            /* Address of a freeblock within pPage->aData[] */
    u8 hdr;            /* Offset to beginning of page header */
    u8 *data;          /* Equal to pPage->aData */
    BtShared *pBt;        /* The main btree structure */
    int usableSize;    /* Amount of usable space on each page */
    u16 cellOffset;    /* Offset from start of page to first cell pointer */
    int nFree;         /* Number of unused bytes on the page */
    int top;           /* First byte of the cell content area */
    int iCellFirst;    /* First allowable cell or freeblock offset */
    int iCellLast;     /* Last possible cell or freeblock offset */

    pBt = pPage->pBt;

    hdr = pPage->hdrOffset;
    data = pPage->aData;
    /* EVIDENCE-OF: R-28594-02890 The one-byte flag at offset 0 indicating
    ** the b-tree page type. */
    if( decodeFlags(pPage, data[hdr]) ) return SQLITE_CORRUPT_BKPT;
    assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
    pPage->maskPage = (u16)(pBt->pageSize - 1);
    pPage->nOverflow = 0;
    usableSize = pBt->usableSize;
    pPage->cellOffset = cellOffset = hdr + 8 + pPage->childPtrSize;
    pPage->aDataEnd = &data[usableSize];
    pPage->aCellIdx = &data[cellOffset];
    pPage->aDataOfst = &data[pPage->childPtrSize];
    /* EVIDENCE-OF: R-58015-48175 The two-byte integer at offset 5 designates
    ** the start of the cell content area. A zero value for this integer is
    ** interpreted as 65536. */
    top = get2byteNotZero(&data[hdr+5]);
    /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
    ** number of cells on the page. */
    pPage->nCell = get2byte(&data[hdr+3]);
    if( pPage->nCell>MX_CELL(pBt) ){
      /* To many cells for a single page.  The page must be corrupt */
      return SQLITE_CORRUPT_BKPT;
    }
    testcase( pPage->nCell==MX_CELL(pBt) );
    /* EVIDENCE-OF: R-24089-57979 If a page contains no cells (which is only
    ** possible for a root page of a table that contains no rows) then the
    ** offset to the cell content area will equal the page size minus the
    ** bytes of reserved space. */
    assert( pPage->nCell>0 || top==usableSize || CORRUPT_DB );

    /* A malformed database page might cause us to read past the end
    ** of page when parsing a cell.  
    **
    ** The following block of code checks early to see if a cell extends
    ** past the end of a page boundary and causes SQLITE_CORRUPT to be 
    ** returned if it does.
    */
    iCellFirst = cellOffset + 2*pPage->nCell;
    iCellLast = usableSize - 4;
    if( pBt->db->flags & SQLITE_CellSizeCk ){
      int i;            /* Index into the cell pointer array */
      int sz;           /* Size of a cell */

      if( !pPage->leaf ) iCellLast--;
      for(i=0; i<pPage->nCell; i++){
        pc = get2byteAligned(&data[cellOffset+i*2]);
        testcase( pc==iCellFirst );
        testcase( pc==iCellLast );
        if( pc<iCellFirst || pc>iCellLast ){
          return SQLITE_CORRUPT_BKPT;
        }
        sz = pPage->xCellSize(pPage, &data[pc]);
        testcase( pc+sz==usableSize );
        if( pc+sz>usableSize ){
          return SQLITE_CORRUPT_BKPT;
        }
      }
      if( !pPage->leaf ) iCellLast++;
    }  

    /* Compute the total free space on the page
    ** EVIDENCE-OF: R-23588-34450 The two-byte integer at offset 1 gives the
    ** start of the first freeblock on the page, or is zero if there are no
    ** freeblocks. */
    pc = get2byte(&data[hdr+1]);
    nFree = data[hdr+7] + top;  /* Init nFree to non-freeblock free space */
    if( pc>0 ){
      u32 next, size;
      if( pc<iCellFirst ){
        /* EVIDENCE-OF: R-55530-52930 In a well-formed b-tree page, there will
        ** always be at least one cell before the first freeblock.
        */
        return SQLITE_CORRUPT_BKPT; 
      }
      while( 1 ){
        if( pc>iCellLast ){
          return SQLITE_CORRUPT_BKPT; /* Freeblock off the end of the page */
        }
        next = get2byte(&data[pc]);
        size = get2byte(&data[pc+2]);
        nFree = nFree + size;
        if( next<=pc+size+3 ) break;
        pc = next;
      }
      if( next>0 ){
        return SQLITE_CORRUPT_BKPT;  /* Freeblock not in ascending order */
      }
      if( pc+size>(unsigned int)usableSize ){
        return SQLITE_CORRUPT_BKPT;  /* Last freeblock extends past page end */
      }
    }

    /* At this point, nFree contains the sum of the offset to the start
    ** of the cell-content area plus the number of free bytes within
    ** the cell-content area. If this is greater than the usable-size
    ** of the page, then the page must be corrupted. This check also
    ** serves to verify that the offset to the start of the cell-content
    ** area, according to the page header, lies within the page.
    */
    if( nFree>usableSize ){
      return SQLITE_CORRUPT_BKPT; 
    }
    pPage->nFree = (u16)(nFree - iCellFirst);
    pPage->isInit = 1;
  }
  return SQLITE_OK;
}